

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

DataPointer * __thiscall
duckdb::ColumnSegment::GetDataPointer(DataPointer *__return_storage_ptr__,ColumnSegment *this)

{
  CompressionFunction *pCVar1;
  compression_serialize_state_t p_Var2;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var3;
  undefined8 uVar4;
  uint uVar5;
  InternalException *this_00;
  undefined1 local_98 [120];
  
  if (this->segment_type == PERSISTENT) {
    BaseStatistics::Copy((BaseStatistics *)(local_98 + 0x20),&(this->stats).statistics);
    DataPointer::DataPointer(__return_storage_ptr__,(BaseStatistics *)(local_98 + 0x20));
    BaseStatistics::~BaseStatistics((BaseStatistics *)(local_98 + 0x20));
    (__return_storage_ptr__->block_pointer).block_id = this->block_id;
    uVar5 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(this->offset);
    (__return_storage_ptr__->block_pointer).offset = uVar5;
    __return_storage_ptr__->row_start = (this->super_SegmentBase<duckdb::ColumnSegment>).start;
    __return_storage_ptr__->tuple_count =
         (this->super_SegmentBase<duckdb::ColumnSegment>).count.super___atomic_base<unsigned_long>.
         _M_i;
    pCVar1 = (this->function)._M_data;
    __return_storage_ptr__->compression_type = pCVar1->type;
    p_Var2 = pCVar1->serialize_state;
    if (p_Var2 != (compression_serialize_state_t)0x0) {
      (*p_Var2)((ColumnSegment *)local_98);
      uVar4 = local_98._0_8_;
      local_98._0_8_ = (long *)0x0;
      _Var3._M_head_impl =
           (__return_storage_ptr__->segment_state).
           super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
           .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
      (__return_storage_ptr__->segment_state).
      super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
      .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
           (ColumnSegmentState *)uVar4;
      if (_Var3._M_head_impl != (ColumnSegmentState *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_ColumnSegmentState + 8))();
        if ((long *)local_98._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_98._0_8_ + 8))();
        }
      }
    }
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_98._0_8_ = local_98 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "Attempting to call ColumnSegment::GetDataPointer on a transient segment","");
  InternalException::InternalException(this_00,(string *)local_98);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DataPointer ColumnSegment::GetDataPointer() {
	if (segment_type != ColumnSegmentType::PERSISTENT) {
		throw InternalException("Attempting to call ColumnSegment::GetDataPointer on a transient segment");
	}
	// set up the data pointer directly using the data from the persistent segment
	DataPointer pointer(stats.statistics.Copy());
	pointer.block_pointer.block_id = GetBlockId();
	pointer.block_pointer.offset = NumericCast<uint32_t>(GetBlockOffset());
	pointer.row_start = start;
	pointer.tuple_count = count;
	pointer.compression_type = function.get().type;
	if (function.get().serialize_state) {
		pointer.segment_state = function.get().serialize_state(*this);
	}
	return pointer;
}